

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_acceptance.c
# Opt level: O0

REF_STATUS ref_acceptance_q(REF_NODE ref_node,char *function_name,REF_INT *ldim,REF_DBL **scalar)

{
  int iVar1;
  uint uVar2;
  REF_DBL *pRVar3;
  int local_140;
  REF_INT i_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_DBL primitive_4 [6];
  int local_100;
  REF_INT i_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_DBL primitive_3 [5];
  REF_INT i_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_DBL primitive_2 [5];
  REF_INT i_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_DBL primitive_1 [5];
  REF_INT i_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL primitive [5];
  int local_38;
  int local_34;
  REF_INT i;
  REF_INT node;
  REF_DBL **scalar_local;
  REF_INT *ldim_local;
  char *function_name_local;
  REF_NODE ref_node_local;
  
  *ldim = 5;
  iVar1 = strcmp(function_name,"fp-sa");
  if (iVar1 == 0) {
    *ldim = 6;
  }
  iVar1 = strcmp(function_name,"sst");
  if (iVar1 == 0) {
    *ldim = 7;
  }
  if (*ldim * ref_node->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c",
           0x1aa,"ref_acceptance_q","malloc *scalar of REF_DBL negative");
    ref_node_local._4_4_ = 1;
  }
  else {
    pRVar3 = (REF_DBL *)malloc((long)(*ldim * ref_node->max) << 3);
    *scalar = pRVar3;
    if (*scalar == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c",
             0x1aa,"ref_acceptance_q","malloc *scalar of REF_DBL NULL");
      ref_node_local._4_4_ = 2;
    }
    else {
      for (local_34 = 0; local_34 < ref_node->max; local_34 = local_34 + 1) {
        if (((-1 < local_34) && (local_34 < ref_node->max)) && (-1 < ref_node->global[local_34])) {
          iVar1 = strcmp(function_name,"trig");
          if (iVar1 == 0) {
            primitive_1[4]._4_4_ =
                 ref_acceptance_primal_trig
                           (ref_node->real[local_34 * 0xf],ref_node->real[local_34 * 0xf + 1],
                            (REF_DBL *)&i_1);
            if (primitive_1[4]._4_4_ != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                     ,0x1b3,"ref_acceptance_q",(ulong)primitive_1[4]._4_4_,"trig");
              return primitive_1[4]._4_4_;
            }
            for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
              (*scalar)[local_38 + *ldim * local_34] = *(REF_DBL *)(&i_1 + (long)local_38 * 2);
            }
            primitive_1[4]._4_4_ = 0;
          }
          else {
            iVar1 = strcmp(function_name,"vortex");
            if (iVar1 == 0) {
              primitive_2[4]._4_4_ =
                   ref_acceptance_primal_vortex
                             (ref_node->real[local_34 * 0xf],ref_node->real[local_34 * 0xf + 1],
                              (REF_DBL *)&i_2);
              if (primitive_2[4]._4_4_ != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                       ,0x1bb,"ref_acceptance_q",(ulong)primitive_2[4]._4_4_,"vortex");
                return primitive_2[4]._4_4_;
              }
              for (primitive_1[4]._0_4_ = 0; primitive_1[4]._0_4_ < 5;
                  primitive_1[4]._0_4_ = primitive_1[4]._0_4_ + 1) {
                (*scalar)[primitive_1[4]._0_4_ + *ldim * local_34] =
                     *(REF_DBL *)(&i_2 + (long)primitive_1[4]._0_4_ * 2);
              }
              primitive_2[4]._4_4_ = 0;
            }
            else {
              iVar1 = strcmp(function_name,"coax");
              if (iVar1 == 0) {
                primitive_3[4]._4_4_ =
                     ref_acceptance_primal_coax
                               (ref_node->real[local_34 * 0xf],ref_node->real[local_34 * 0xf + 1],
                                (REF_DBL *)&i_3);
                if (primitive_3[4]._4_4_ != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                         ,0x1c3,"ref_acceptance_q",(ulong)primitive_3[4]._4_4_,"coax");
                  return primitive_3[4]._4_4_;
                }
                for (primitive_2[4]._0_4_ = 0; primitive_2[4]._0_4_ < 5;
                    primitive_2[4]._0_4_ = primitive_2[4]._0_4_ + 1) {
                  (*scalar)[primitive_2[4]._0_4_ + *ldim * local_34] =
                       *(REF_DBL *)(&i_3 + (long)primitive_2[4]._0_4_ * 2);
                }
                primitive_3[4]._4_4_ = 0;
              }
              else {
                iVar1 = strcmp(function_name,"ringleb");
                if (iVar1 == 0) {
                  uVar2 = ref_acceptance_primal_ringleb
                                    (ref_node->real[local_34 * 0xf],
                                     ref_node->real[local_34 * 0xf + 1],(REF_DBL *)&i_4);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                           ,0x1cb,"ref_acceptance_q",(ulong)uVar2,"ringleb");
                    return uVar2;
                  }
                  for (primitive_3[4]._0_4_ = 0; primitive_3[4]._0_4_ < 5;
                      primitive_3[4]._0_4_ = primitive_3[4]._0_4_ + 1) {
                    (*scalar)[primitive_3[4]._0_4_ + *ldim * local_34] =
                         *(REF_DBL *)(&i_4 + (long)primitive_3[4]._0_4_ * 2);
                  }
                }
                else {
                  iVar1 = strcmp(function_name,"fp-sa");
                  if (iVar1 == 0) {
                    uVar2 = ref_acceptance_primal_fp_sa
                                      (ref_node->real[local_34 * 0xf + 1],(REF_DBL *)&i_5);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                             ,0x1d2,"ref_acceptance_q",(ulong)uVar2,"flat plate sa");
                      return uVar2;
                    }
                    for (local_100 = 0; local_100 < 6; local_100 = local_100 + 1) {
                      (*scalar)[local_100 + *ldim * local_34] =
                           *(REF_DBL *)(&i_5 + (long)local_100 * 2);
                    }
                  }
                  else {
                    iVar1 = strcmp(function_name,"sst");
                    if (iVar1 != 0) {
                      printf("%s: %d: %s %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                             ,0x1d8,"unknown user function",function_name);
                      return 5;
                    }
                    for (local_140 = 0; local_140 < 7; local_140 = local_140 + 1) {
                      (*scalar)[local_140 + *ldim * local_34] = (double)(local_140 + 1);
                    }
                  }
                }
              }
            }
          }
        }
      }
      ref_node_local._4_4_ = 0;
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_acceptance_q(REF_NODE ref_node,
                                           const char *function_name,
                                           REF_INT *ldim, REF_DBL **scalar) {
  REF_INT node;

  *ldim = 5;
  if (strcmp(function_name, "fp-sa") == 0) {
    *ldim = 6;
  }
  if (strcmp(function_name, "sst") == 0) {
    *ldim = 7;
  }
  ref_malloc(*scalar, (*ldim) * ref_node_max(ref_node), REF_DBL);

  each_ref_node_valid_node(ref_node, node) {
    if (strcmp(function_name, "trig") == 0) {
      REF_INT i;
      REF_DBL primitive[5];
      RSS(ref_acceptance_primal_trig(ref_node_xyz(ref_node, 0, node),
                                     ref_node_xyz(ref_node, 1, node),
                                     primitive),
          "trig");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
    } else if (strcmp(function_name, "vortex") == 0) {
      REF_INT i;
      REF_DBL primitive[5];
      RSS(ref_acceptance_primal_vortex(ref_node_xyz(ref_node, 0, node),
                                       ref_node_xyz(ref_node, 1, node),
                                       primitive),
          "vortex");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
    } else if (strcmp(function_name, "coax") == 0) {
      REF_INT i;
      REF_DBL primitive[5];
      RSS(ref_acceptance_primal_coax(ref_node_xyz(ref_node, 0, node),
                                     ref_node_xyz(ref_node, 1, node),
                                     primitive),
          "coax");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
    } else if (strcmp(function_name, "ringleb") == 0) {
      REF_INT i;
      REF_DBL primitive[5];
      RSS(ref_acceptance_primal_ringleb(ref_node_xyz(ref_node, 0, node),
                                        ref_node_xyz(ref_node, 1, node),
                                        primitive),
          "ringleb");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
    } else if (strcmp(function_name, "fp-sa") == 0) {
      REF_INT i;
      REF_DBL primitive[6];
      RSS(ref_acceptance_primal_fp_sa(ref_node_xyz(ref_node, 1, node),
                                      primitive),
          "flat plate sa");
      for (i = 0; i < 6; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
    } else if (strcmp(function_name, "sst") == 0) {
      REF_INT i;
      for (i = 0; i < 7; i++) (*scalar)[i + (*ldim) * node] = (REF_DBL)(i + 1);
    } else {
      printf("%s: %d: %s %s\n", __FILE__, __LINE__, "unknown user function",
             function_name);
      return REF_NOT_FOUND;
    }
  }
  return REF_SUCCESS;
}